

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdTest555(void)

{
  int nWords_00;
  int iVar1;
  FILE *__stream;
  abctime aVar2;
  char *pcVar3;
  size_t sVar4;
  word *pwVar5;
  abctime aVar6;
  abctime aVar7;
  char *local_1418;
  char *local_1408;
  char *pStr2;
  abctime clk2;
  abctime clkDec;
  abctime clk;
  int local_13e0;
  int Counter;
  int i;
  int nSizeNonDec;
  char pRes [2000];
  char pBuffer [2000];
  word *pTruth;
  word Tru [2] [64];
  FILE *pFile;
  char *pFileName;
  int nWords;
  int nVars;
  
  nWords_00 = Abc_TtWordNum(10);
  __stream = fopen("_npn/npn/dsd10.txt","rb");
  clk._4_4_ = 0;
  aVar2 = Abc_Clock();
  clk2 = 0;
  do {
    do {
      pcVar3 = fgets(pRes + 0x7c8,2000,__stream);
      if (pcVar3 == (char *)0x0) {
        printf("Finished trying %d decompositions.  ",(ulong)clk._4_4_);
        Abc_PrintTime(1,"Time",clk2);
        aVar6 = Abc_Clock();
        Abc_PrintTime(1,"Total",aVar6 - aVar2);
        Abc_PrintTime(1,"Time1",s_Times[0]);
        Abc_PrintTime(1,"Time2",s_Times[1]);
        Abc_PrintTime(1,"Time3",s_Times[2]);
        fclose(__stream);
        return;
      }
      sVar4 = strlen(pRes + 0x7c8);
      pcVar3 = pRes + sVar4 + 0x7c7;
      local_1408 = pcVar3;
      if (*pcVar3 == '\n') {
        local_1408 = pRes + sVar4 + 0x7c6;
        *pcVar3 = '\0';
      }
      if (*local_1408 == '\r') {
        *local_1408 = '\0';
      }
    } while ((pRes[0x7c8] == 'V') || (pRes[0x7c8] == '\0'));
    clk._4_4_ = clk._4_4_ + 1;
    for (local_13e0 = 0; local_13e0 < 1; local_13e0 = local_13e0 + 1) {
      if (pRes[0x7c8] == '*') {
        local_1418 = pRes + 0x7c9;
      }
      else {
        local_1418 = pRes + 0x7c8;
      }
      pwVar5 = Dau_DsdToTruth(local_1418,10);
      Abc_TtCopy((word *)&pTruth,pwVar5,nWords_00,0);
      Abc_TtCopy(Tru[0] + 0x3f,pwVar5,nWords_00,0);
      aVar6 = Abc_Clock();
      iVar1 = Dau_DsdDecompose(Tru[0] + 0x3f,10,0,1,(char *)&i);
      aVar7 = Abc_Clock();
      clk2 = (aVar7 - aVar6) + clk2;
      Dau_DsdNormalize((char *)&i);
      if (iVar1 != 0) {
        __assert_fail("nSizeNonDec == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x814,"void Dau_DsdTest555()");
      }
      pwVar5 = Dau_DsdToTruth((char *)&i,10);
      iVar1 = Abc_TtEqual(pwVar5,(word *)&pTruth,nWords_00);
      if (iVar1 == 0) {
        printf("%s -> %s \n",pRes + 0x7c8,&i);
        printf("Verification failed.\n");
      }
    }
  } while( true );
}

Assistant:

void Dau_DsdTest555()
{
    int nVars = 10;
    int nWords = Abc_TtWordNum(nVars);
    char * pFileName = "_npn/npn/dsd10.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    word Tru[2][DAU_MAX_WORD], * pTruth;
    char pBuffer[DAU_MAX_STR];
    char pRes[DAU_MAX_STR];
    int nSizeNonDec;
    int i, Counter = 0;
    abctime clk = Abc_Clock(), clkDec = 0, clk2;
//    return;

    while ( fgets( pBuffer, DAU_MAX_STR, pFile ) != NULL )
    {
        char * pStr2 = pBuffer + strlen(pBuffer)-1;
        if ( *pStr2 == '\n' )
            *pStr2-- = 0;
        if ( *pStr2 == '\r' )
            *pStr2-- = 0;
        if ( pBuffer[0] == 'V' || pBuffer[0] == 0 )
            continue;
        Counter++; 

        for ( i = 0; i < 1; i++ )
        {
//            Dau_DsdPermute( pBuffer );
            pTruth = Dau_DsdToTruth( pBuffer[0] == '*' ? pBuffer + 1 : pBuffer, nVars );
            Abc_TtCopy( Tru[0], pTruth, nWords, 0 );
            Abc_TtCopy( Tru[1], pTruth, nWords, 0 );
            clk2 = Abc_Clock();
            nSizeNonDec = Dau_DsdDecompose( Tru[1], nVars, 0, 1, pRes );
            clkDec += Abc_Clock() - clk2;
            Dau_DsdNormalize( pRes );
//            pStr2 = Dau_DsdPerform( t ); nSizeNonDec = 0;
            assert( nSizeNonDec == 0 );
            pTruth = Dau_DsdToTruth( pRes, nVars );
            if ( !Abc_TtEqual( pTruth, Tru[0], nWords ) )
            {
    //        Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );
    //        printf( "  " );
    //        Kit_DsdPrintFromTruth( (unsigned *)&t2, 6 );
                printf( "%s -> %s \n", pBuffer, pRes );
                printf( "Verification failed.\n" );
            }
        }
    }
    printf( "Finished trying %d decompositions.  ", Counter );
    Abc_PrintTime( 1, "Time", clkDec );
    Abc_PrintTime( 1, "Total", Abc_Clock() - clk );

    Abc_PrintTime( 1, "Time1", s_Times[0] );
    Abc_PrintTime( 1, "Time2", s_Times[1] );
    Abc_PrintTime( 1, "Time3", s_Times[2] );

    fclose( pFile );
}